

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEdit::append(QTextEdit *this,QString *text)

{
  undefined1 uVar1;
  int iVar2;
  int iVar3;
  QTextEditPrivate *pQVar4;
  QAbstractSlider *in_RDI;
  long in_FS_OFFSET;
  bool atBottom;
  QTextEditPrivate *d;
  QString *in_stack_ffffffffffffffa8;
  QTextEdit *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  byte bVar5;
  undefined4 in_stack_ffffffffffffffc4;
  bool local_2a;
  QTextCursor local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QTextEdit *)0x6d638f);
  local_2a = isReadOnly(in_stack_ffffffffffffffb0);
  if (local_2a) {
    iVar2 = QTextEditPrivate::verticalOffset((QTextEditPrivate *)0x6d63b3);
    iVar3 = QAbstractSlider::maximum((QAbstractSlider *)in_stack_ffffffffffffffb0);
    iVar2 = CONCAT13(iVar3 <= iVar2,(int3)in_stack_ffffffffffffffc4);
  }
  else {
    QWidgetTextControl::textCursor
              ((QWidgetTextControl *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    uVar1 = QTextCursor::atEnd();
    iVar2 = CONCAT13(uVar1,(int3)in_stack_ffffffffffffffc4);
  }
  local_2a = !local_2a;
  bVar5 = (byte)((uint)iVar2 >> 0x18);
  if (local_2a) {
    QTextCursor::~QTextCursor(local_10);
  }
  QWidgetTextControl::append
            ((QWidgetTextControl *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if ((bVar5 & 1) != 0) {
    QAbstractSlider::maximum
              (&((pQVar4->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider);
    QAbstractSlider::setValue(in_RDI,iVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextEdit::append(const QString &text)
{
    Q_D(QTextEdit);
    const bool atBottom = isReadOnly() ?  d->verticalOffset() >= d->vbar->maximum() :
            d->control->textCursor().atEnd();
    d->control->append(text);
    if (atBottom)
        d->vbar->setValue(d->vbar->maximum());
}